

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Promise<unsigned_long> __thiscall
kj::anon_unknown_123::AllReader::loop(AllReader *this,uint64_t limit)

{
  PromiseArena *pPVar1;
  SourceLocation location;
  undefined8 uVar2;
  uchar *puVar3;
  void *pvVar4;
  char *in_RDX;
  SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:188:15)>
  *location_00;
  char *count;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  DebugComparison<unsigned_long_&,_int> _kjCondition;
  Fault f;
  Array<unsigned_char> part;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a8;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a0;
  code *local_98;
  undefined1 local_90 [16];
  char *local_80;
  char *local_78;
  bool local_70;
  Fault local_68;
  undefined *puStack_60;
  undefined8 local_58;
  undefined1 local_50 [24];
  char *local_38;
  undefined8 *local_30;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_28;
  
  local_90._0_8_ = local_50;
  local_90._8_8_ = local_90._8_8_ & 0xffffffff00000000;
  local_80 = " > ";
  local_78 = (char *)0x4;
  local_70 = in_RDX != (char *)0x0;
  if (local_70) {
    count = (char *)0x1000;
    if (in_RDX < (char *)0x1000) {
      count = in_RDX;
    }
    local_50._0_8_ = in_RDX;
    puVar3 = kj::_::HeapArrayDisposer::allocate<unsigned_char>((size_t)count);
    local_30 = &kj::_::HeapArrayDisposer::instance;
    local_50._16_8_ = puVar3;
    local_38 = count;
    Vector<kj::Array<unsigned_char>>::add<kj::Array<unsigned_char>>
              ((Vector<kj::Array<unsigned_char>> *)(limit + 8),
               (Array<unsigned_char> *)(local_50 + 0x10));
    (**(code **)(**(long **)limit + 8))(&local_a8,*(long **)limit,puVar3,count,count);
    local_78 = (char *)local_50._0_8_;
    local_98 = kj::_::
               SimpleTransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:188:15)>
               ::anon_class_32_3_f55ac5fb_for_func::operator();
    pPVar1 = ((local_a8.ptr)->super_PromiseArenaMember).arena;
    local_90._0_8_ = limit;
    local_90._8_8_ = puVar3;
    local_80 = count;
    if (pPVar1 == (PromiseArena *)0x0 || (ulong)((long)local_a8.ptr - (long)pPVar1) < 0x40) {
      pvVar4 = operator_new(0x400);
      location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:188:15)>
                     *)((long)pvVar4 + 0x3c0);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AllReader::loop(unsigned_long)::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AllReader::loop(unsigned_long)::_lambda(unsigned_long)_1_,void*&>
                (location_00,&local_a8,(anon_class_32_3_f55ac5fb_for_func *)local_90,&local_98);
      *(void **)((long)pvVar4 + 0x3c8) = pvVar4;
    }
    else {
      ((local_a8.ptr)->super_PromiseArenaMember).arena = (PromiseArena *)0x0;
      location_00 = (SimpleTransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:188:15)>
                     *)(local_a8.ptr + -4);
      ctor<kj::_::SimpleTransformPromiseNode<unsigned_long,kj::(anonymous_namespace)::AllReader::loop(unsigned_long)::_lambda(unsigned_long)_1_>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,kj::(anonymous_namespace)::AllReader::loop(unsigned_long)::_lambda(unsigned_long)_1_,void*&>
                (location_00,&local_a8,(anon_class_32_3_f55ac5fb_for_func *)local_90,&local_98);
      local_a8.ptr[-4].super_PromiseArenaMember.arena = pPVar1;
    }
    local_68.exception = (Exception *)&DAT_003d3151;
    puStack_60 = &DAT_003d31b0;
    local_58 = 0x4c0000058b;
    location.function = &DAT_003d31b0;
    location.fileName = &DAT_003d3151;
    location.lineNumber = 0x58b;
    location.columnNumber = 0x4c;
    local_a0.ptr = (PromiseNode *)location_00;
    kj::_::maybeChain<unsigned_long>
              ((OwnPromiseNode *)(local_50 + 8),(Promise<unsigned_long> *)&local_a0,location);
    uVar2 = local_50._8_8_;
    local_50._8_8_ = 0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
              ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)(local_50 + 8));
    this->input = (AsyncInputStream *)uVar2;
    local_28.ptr = (PromiseNode *)0x0;
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_28);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a0);
    Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
    Array<unsigned_char>::~Array((Array<unsigned_char> *)(local_50 + 0x10));
    return (PromiseBase)(PromiseBase)this;
  }
  kj::_::Debug::Fault::
  Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long&,int>&,char_const(&)[26]>
            (&local_68,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0xb6,FAILED,"limit > 0","_kjCondition,\"Reached limit before EOF.\"",
             (DebugComparison<unsigned_long_&,_int> *)local_90,
             (char (*) [26])"Reached limit before EOF.");
  kj::_::Debug::Fault::fatal(&local_68);
}

Assistant:

Promise<uint64_t> loop(uint64_t limit) {
    KJ_REQUIRE(limit > 0, "Reached limit before EOF.");

    auto part = heapArray<byte>(kj::min(4096, limit));
    auto partPtr = part.asPtr();
    parts.add(kj::mv(part));
    return input.tryRead(partPtr.begin(), partPtr.size(), partPtr.size())
        .then([this,KJ_CPCAP(partPtr),limit](size_t amount) mutable -> Promise<uint64_t> {
      limit -= amount;
      if (amount < partPtr.size()) {
        return limit;
      } else {
        return loop(limit);
      }
    });
  }